

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::DataSegmentModuleField::~DataSegmentModuleField(DataSegmentModuleField *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  Expr *pEVar3;
  pointer pcVar4;
  _func_int ***ppp_Var5;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__DataSegmentModuleField_00169e00;
  puVar2 = (this->data_segment).data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->data_segment).data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  pEVar3 = (this->data_segment).offset.first_;
  while (pEVar3 != (Expr *)0x0) {
    ppp_Var5 = &pEVar3->_vptr_Expr;
    pEVar3 = (pEVar3->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var5)[1])();
  }
  (this->data_segment).offset.first_ = (Expr *)0x0;
  (this->data_segment).offset.last_ = (Expr *)0x0;
  (this->data_segment).offset.size_ = 0;
  Var::~Var(&(this->data_segment).memory_var);
  pcVar4 = (this->data_segment).name._M_dataplus._M_p;
  paVar1 = &(this->data_segment).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0xe0);
  return;
}

Assistant:

explicit DataSegmentModuleField(const Location& loc = Location(),
                                  std::string_view name = std::string_view())
      : ModuleFieldMixin<ModuleFieldType::DataSegment>(loc),
        data_segment(name) {}